

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_string_with_real(void)

{
  error *ex_11;
  undefined1 local_72b;
  undefined1 local_72a [2];
  undefined1 local_728 [8];
  variable data_11;
  error *ex_10;
  undefined1 local_68b;
  undefined1 local_68a [2];
  undefined1 local_688 [8];
  variable data_10;
  error *ex_9;
  undefined1 local_5eb;
  undefined1 local_5ea [2];
  undefined1 local_5e8 [8];
  variable data_9;
  error *ex_8;
  undefined1 local_54b;
  undefined1 local_54a [2];
  undefined1 local_548 [8];
  variable data_8;
  error *ex_7;
  undefined1 local_4ab;
  undefined1 local_4aa [2];
  undefined1 local_4a8 [8];
  variable data_7;
  error *ex_6;
  undefined1 local_40b;
  undefined1 local_40a [2];
  undefined1 local_408 [8];
  variable data_6;
  error *ex_5;
  undefined1 local_36b;
  undefined1 local_36a [2];
  undefined1 local_368 [8];
  variable data_5;
  error *ex_4;
  undefined1 local_2cb;
  undefined1 local_2ca [2];
  undefined1 local_2c8 [8];
  variable data_4;
  error *ex_3;
  undefined1 local_22b;
  undefined1 local_22a [2];
  undefined1 local_228 [8];
  variable data_3;
  error *ex_2;
  undefined1 local_18b;
  undefined1 local_18a [2];
  undefined1 local_188 [8];
  variable data_2;
  error *ex_1;
  undefined1 local_eb;
  undefined1 local_ea [2];
  undefined1 local_e8 [8];
  variable data_1;
  error *ex;
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,"alpha");
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x55f,"void append_suite::append_string_with_real()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)&ex,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)&ex);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0f))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x562,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e8,"alpha");
  local_ea[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                          ((basic_variable<std::allocator<char>_> *)local_e8);
  local_eb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x567,"void append_suite::append_string_with_real()",local_ea,&local_eb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&ex_1,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_e8,
             (basic_variable<std::allocator<char>_> *)&ex_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x56a,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_188,"alpha");
  local_18a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                           ((basic_variable<std::allocator<char>_> *)local_188);
  local_18b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x56f,"void append_suite::append_string_with_real()",local_18a,&local_18b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)&ex_2,(longdouble)3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_188,
             (basic_variable<std::allocator<char>_> *)&ex_2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_2);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0L))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x572,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_228,L"bravo");
  local_22a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                           ((basic_variable<std::allocator<char>_> *)local_228);
  local_22b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x577,"void append_suite::append_string_with_real()",local_22a,&local_22b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)&ex_3,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_228,
             (basic_variable<std::allocator<char>_> *)&ex_3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_3);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0f))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x57a,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2c8,L"bravo");
  local_2ca[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                           ((basic_variable<std::allocator<char>_> *)local_2c8);
  local_2cb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x57f,"void append_suite::append_string_with_real()",local_2ca,&local_2cb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&ex_4,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_2c8,
             (basic_variable<std::allocator<char>_> *)&ex_4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_4);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x582,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_368,L"bravo");
  local_36a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                           ((basic_variable<std::allocator<char>_> *)local_368);
  local_36b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x587,"void append_suite::append_string_with_real()",local_36a,&local_36b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)&ex_5,(longdouble)3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_368,
             (basic_variable<std::allocator<char>_> *)&ex_5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_5);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0L))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x58a,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_408,L"charlie");
  local_40a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u16string>((basic_variable<std::allocator<char>_> *)local_408);
  local_40b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x58f,"void append_suite::append_string_with_real()",local_40a,&local_40b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)&ex_6,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_408,
             (basic_variable<std::allocator<char>_> *)&ex_6);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_6);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0f))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x592,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_4a8,L"charlie");
  local_4aa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u16string>((basic_variable<std::allocator<char>_> *)local_4a8);
  local_4ab = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x597,"void append_suite::append_string_with_real()",local_4aa,&local_4ab);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&ex_7,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_4a8,
             (basic_variable<std::allocator<char>_> *)&ex_7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_7);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x59a,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_548,L"charlie");
  local_54a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u16string>((basic_variable<std::allocator<char>_> *)local_548);
  local_54b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x59f,"void append_suite::append_string_with_real()",local_54a,&local_54b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)&ex_8,(longdouble)3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_548,
             (basic_variable<std::allocator<char>_> *)&ex_8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_8);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0L))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5a2,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_5e8,L"delta");
  local_5ea[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u32string>((basic_variable<std::allocator<char>_> *)local_5e8);
  local_5eb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5a7,"void append_suite::append_string_with_real()",local_5ea,&local_5eb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)&ex_9,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_5e8,
             (basic_variable<std::allocator<char>_> *)&ex_9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_9);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0f))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5aa,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_688,L"delta");
  local_68a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u32string>((basic_variable<std::allocator<char>_> *)local_688);
  local_68b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5af,"void append_suite::append_string_with_real()",local_68a,&local_68b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&ex_10,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_688,
             (basic_variable<std::allocator<char>_> *)&ex_10);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_10);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5b2,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_688);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_728,L"delta");
  local_72a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u32string>((basic_variable<std::allocator<char>_> *)local_728);
  local_72b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5b7,"void append_suite::append_string_with_real()",local_72a,&local_72b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)&ex_11,(longdouble)3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_728,
             (basic_variable<std::allocator<char>_> *)&ex_11);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_11);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(3.0L))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x5ba,"void append_suite::append_string_with_real()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_728);
  return;
}

Assistant:

void append_string_with_real()
{
    // string - float
    {
        variable data("alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0f)),
                                        error,
                                        "incompatible type");
    }
    // string - double
    {
        variable data("alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0)),
                                        error,
                                        "incompatible type");
    }
    // string - long double
    {
        variable data("alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0L)),
                                        error,
                                        "incompatible type");
    }
    // wstring - float
    {
        variable data(L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0f)),
                                        error,
                                        "incompatible type");
    }
    // wstring - double
    {
        variable data(L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0)),
                                        error,
                                        "incompatible type");
    }
    // wstring - long double
    {
        variable data(L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0L)),
                                        error,
                                        "incompatible type");
    }
    // u16string - float
    {
        variable data(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0f)),
                                        error,
                                        "incompatible type");
    }
    // u16string - double
    {
        variable data(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0)),
                                        error,
                                        "incompatible type");
    }
    // u16string - long double
    {
        variable data(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0L)),
                                        error,
                                        "incompatible type");
    }
    // u32string - float
    {
        variable data(U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0f)),
                                        error,
                                        "incompatible type");
    }
    // u32string - double
    {
        variable data(U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0)),
                                        error,
                                        "incompatible type");
    }
    // u32string - long double
    {
        variable data(U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u32string>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(3.0L)),
                                        error,
                                        "incompatible type");
    }
}